

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall cmCTestTestHandler::GetListOfTests(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  cmState *pcVar2;
  bool bVar3;
  ostream *poVar4;
  cmMakefile *this_00;
  string *psVar5;
  cmCommand *pcVar6;
  char *filename;
  auto_ptr<cmMakefile> mf;
  char *local_a38 [4];
  ostringstream cmCTestLog_msg_1;
  cmake cm;
  cmGlobalGenerator gg;
  
  if ((this->IncludeLabelRegExp)._M_string_length != 0) {
    cmsys::RegularExpression::compile
              (&this->IncludeLabelRegularExpression,(this->IncludeLabelRegExp)._M_dataplus._M_p);
  }
  if ((this->ExcludeLabelRegExp)._M_string_length != 0) {
    cmsys::RegularExpression::compile
              (&this->ExcludeLabelRegularExpression,(this->ExcludeLabelRegExp)._M_dataplus._M_p);
  }
  if ((this->IncludeRegExp)._M_string_length != 0) {
    cmsys::RegularExpression::compile
              (&this->IncludeTestsRegularExpression,(this->IncludeRegExp)._M_dataplus._M_p);
  }
  if ((this->ExcludeRegExp)._M_string_length != 0) {
    cmsys::RegularExpression::compile
              (&this->ExcludeTestsRegularExpression,(this->ExcludeRegExp)._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&gg);
  poVar4 = std::operator<<((ostream *)&gg,"Constructing a list of tests");
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x6d7,(char *)cm.Generators.
                              super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
               (this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&cm);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gg);
  cmake::cmake(&cm,RoleScript);
  std::__cxx11::string::string((string *)&gg,"",(allocator *)&cmCTestLog_msg_1);
  cmake::SetHomeDirectory(&cm,(string *)&gg);
  std::__cxx11::string::~string((string *)&gg);
  std::__cxx11::string::string((string *)&gg,"",(allocator *)&cmCTestLog_msg_1);
  cmake::SetHomeOutputDirectory(&cm,(string *)&gg);
  std::__cxx11::string::~string((string *)&gg);
  gg.MakeSilentFlag._M_dataplus._M_p = (pointer)cm.CurrentSnapshot.Position.Position;
  gg._vptr_cmGlobalGenerator = (_func_int **)cm.CurrentSnapshot.State;
  gg._8_8_ = cm.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&gg);
  cmGlobalGenerator::cmGlobalGenerator(&gg,&cm);
  this_00 = (cmMakefile *)operator_new(0x760);
  _cmCTestLog_msg_1 = (pointer)cm.CurrentSnapshot.State;
  cmMakefile::cmMakefile(this_00,&gg,(cmStateSnapshot *)&cmCTestLog_msg_1);
  mf.x_ = this_00;
  std::__cxx11::string::string
            ((string *)&cmCTestLog_msg_1,"CTEST_CONFIGURATION_TYPE",(allocator *)local_a38);
  psVar5 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  cmMakefile::AddDefinition(this_00,(string *)&cmCTestLog_msg_1,(psVar5->_M_dataplus)._M_p);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  pcVar6 = (cmCommand *)operator_new(0x38);
  pcVar2 = cm.State;
  pcVar6->Makefile = (cmMakefile *)0x0;
  (pcVar6->Error)._M_dataplus._M_p = (pointer)&(pcVar6->Error).field_2;
  (pcVar6->Error)._M_string_length = 0;
  (pcVar6->Error).field_2._M_local_buf[0] = '\0';
  pcVar6->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_0072ad50;
  pcVar6[1]._vptr_cmCommand = (_func_int **)this;
  std::__cxx11::string::string((string *)&cmCTestLog_msg_1,"add_test",(allocator *)local_a38);
  cmState::AddBuiltinCommand(pcVar2,(string *)&cmCTestLog_msg_1,pcVar6);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  pcVar6 = (cmCommand *)operator_new(0x38);
  pcVar2 = cm.State;
  pcVar6->Makefile = (cmMakefile *)0x0;
  (pcVar6->Error)._M_dataplus._M_p = (pointer)&(pcVar6->Error).field_2;
  (pcVar6->Error)._M_string_length = 0;
  (pcVar6->Error).field_2._M_local_buf[0] = '\0';
  pcVar6->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_0072ac90;
  pcVar6[1]._vptr_cmCommand = (_func_int **)this;
  std::__cxx11::string::string((string *)&cmCTestLog_msg_1,"subdirs",(allocator *)local_a38);
  cmState::AddBuiltinCommand(pcVar2,(string *)&cmCTestLog_msg_1,pcVar6);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  pcVar6 = (cmCommand *)operator_new(0x38);
  pcVar2 = cm.State;
  pcVar6->Makefile = (cmMakefile *)0x0;
  (pcVar6->Error)._M_dataplus._M_p = (pointer)&(pcVar6->Error).field_2;
  (pcVar6->Error)._M_string_length = 0;
  (pcVar6->Error).field_2._M_local_buf[0] = '\0';
  pcVar6->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_0072acf0;
  pcVar6[1]._vptr_cmCommand = (_func_int **)this;
  std::__cxx11::string::string
            ((string *)&cmCTestLog_msg_1,"add_subdirectory",(allocator *)local_a38);
  cmState::AddBuiltinCommand(pcVar2,(string *)&cmCTestLog_msg_1,pcVar6);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  pcVar6 = (cmCommand *)operator_new(0x38);
  pcVar2 = cm.State;
  pcVar6->Makefile = (cmMakefile *)0x0;
  (pcVar6->Error)._M_dataplus._M_p = (pointer)&(pcVar6->Error).field_2;
  (pcVar6->Error)._M_string_length = 0;
  (pcVar6->Error).field_2._M_local_buf[0] = '\0';
  pcVar6->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_0072adb0;
  pcVar6[1]._vptr_cmCommand = (_func_int **)this;
  std::__cxx11::string::string
            ((string *)&cmCTestLog_msg_1,"set_tests_properties",(allocator *)local_a38);
  cmState::AddBuiltinCommand(pcVar2,(string *)&cmCTestLog_msg_1,pcVar6);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  pcVar6 = (cmCommand *)operator_new(0x38);
  pcVar6->Makefile = (cmMakefile *)0x0;
  (pcVar6->Error)._M_dataplus._M_p = (pointer)&(pcVar6->Error).field_2;
  (pcVar6->Error)._M_string_length = 0;
  (pcVar6->Error).field_2._M_local_buf[0] = '\0';
  pcVar6->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_0072ae10;
  pcVar6[1]._vptr_cmCommand = (_func_int **)this;
  std::__cxx11::string::string
            ((string *)&cmCTestLog_msg_1,"set_directory_properties",(allocator *)local_a38);
  cmState::AddBuiltinCommand(cm.State,(string *)&cmCTestLog_msg_1,pcVar6);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  filename = "CTestTestfile.cmake";
  bVar3 = cmsys::SystemTools::FileExists("CTestTestfile.cmake");
  if (!bVar3) {
    filename = "DartTestfile.txt";
    bVar3 = cmsys::SystemTools::FileExists("DartTestfile.txt");
    if (!bVar3) goto LAB_0032422b;
  }
  bVar3 = cmMakefile::ReadListFile(mf.x_,filename);
  if (bVar3) {
    bVar3 = cmSystemTools::GetErrorOccuredFlag();
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_1);
      poVar4 = std::operator<<((ostream *)&cmCTestLog_msg_1,"Done constructing a list of tests");
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x70f,local_a38[0],(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)local_a38);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_1);
    }
  }
LAB_0032422b:
  ::cm::auto_ptr<cmMakefile>::~auto_ptr(&mf);
  cmGlobalGenerator::~cmGlobalGenerator(&gg);
  cmake::~cmake(&cm);
  return;
}

Assistant:

void cmCTestTestHandler::GetListOfTests()
{
  if (!this->IncludeLabelRegExp.empty()) {
    this->IncludeLabelRegularExpression.compile(
      this->IncludeLabelRegExp.c_str());
  }
  if (!this->ExcludeLabelRegExp.empty()) {
    this->ExcludeLabelRegularExpression.compile(
      this->ExcludeLabelRegExp.c_str());
  }
  if (!this->IncludeRegExp.empty()) {
    this->IncludeTestsRegularExpression.compile(this->IncludeRegExp.c_str());
  }
  if (!this->ExcludeRegExp.empty()) {
    this->ExcludeTestsRegularExpression.compile(this->ExcludeRegExp.c_str());
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Constructing a list of tests" << std::endl, this->Quiet);
  cmake cm(cmake::RoleScript);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  CM_AUTO_PTR<cmMakefile> mf(new cmMakefile(&gg, cm.GetCurrentSnapshot()));
  mf->AddDefinition("CTEST_CONFIGURATION_TYPE",
                    this->CTest->GetConfigType().c_str());

  // Add handler for ADD_TEST
  cmCTestAddTestCommand* newCom1 = new cmCTestAddTestCommand;
  newCom1->TestHandler = this;
  cm.GetState()->AddBuiltinCommand("add_test", newCom1);

  // Add handler for SUBDIRS
  cmCTestSubdirCommand* newCom2 = new cmCTestSubdirCommand;
  newCom2->TestHandler = this;
  cm.GetState()->AddBuiltinCommand("subdirs", newCom2);

  // Add handler for ADD_SUBDIRECTORY
  cmCTestAddSubdirectoryCommand* newCom3 = new cmCTestAddSubdirectoryCommand;
  newCom3->TestHandler = this;
  cm.GetState()->AddBuiltinCommand("add_subdirectory", newCom3);

  // Add handler for SET_TESTS_PROPERTIES
  cmCTestSetTestsPropertiesCommand* newCom4 =
    new cmCTestSetTestsPropertiesCommand;
  newCom4->TestHandler = this;
  cm.GetState()->AddBuiltinCommand("set_tests_properties", newCom4);

  // Add handler for SET_DIRECTORY_PROPERTIES
  cmCTestSetDirectoryPropertiesCommand* newCom5 =
    new cmCTestSetDirectoryPropertiesCommand;
  newCom5->TestHandler = this;
  cm.GetState()->AddBuiltinCommand("set_directory_properties", newCom5);

  const char* testFilename;
  if (cmSystemTools::FileExists("CTestTestfile.cmake")) {
    // does the CTestTestfile.cmake exist ?
    testFilename = "CTestTestfile.cmake";
  } else if (cmSystemTools::FileExists("DartTestfile.txt")) {
    // does the DartTestfile.txt exist ?
    testFilename = "DartTestfile.txt";
  } else {
    return;
  }

  if (!mf->ReadListFile(testFilename)) {
    return;
  }
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return;
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Done constructing a list of tests" << std::endl,
                     this->Quiet);
}